

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skein.c
# Opt level: O3

int Skein1024_Init(Skein1024_Ctxt_t *ctx,size_t hashBitLen)

{
  long lVar1;
  u64b_t *puVar2;
  u64b_t *puVar3;
  u08b_t local_88 [8];
  size_t local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  (ctx->h).hashBitLen = hashBitLen;
  if (hashBitLen == 0x180) {
    puVar2 = SKEIN1024_IV_384;
  }
  else if (hashBitLen == 0x400) {
    puVar2 = SKEIN1024_IV_1024;
  }
  else {
    if (hashBitLen != 0x200) {
      (ctx->h).T[1] = 0xc400000000000000;
      (ctx->h).bCnt = 0;
      (ctx->h).T[0] = 0;
      builtin_memcpy(local_88,"SHA3\x01",6);
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      uStack_30 = 0;
      local_28 = 0;
      uStack_20 = 0;
      local_18 = 0;
      uStack_10 = 0;
      ctx->X[0xe] = 0;
      ctx->X[0xf] = 0;
      ctx->X[0xc] = 0;
      ctx->X[0xd] = 0;
      ctx->X[10] = 0;
      ctx->X[0xb] = 0;
      ctx->X[8] = 0;
      ctx->X[9] = 0;
      ctx->X[6] = 0;
      ctx->X[7] = 0;
      ctx->X[4] = 0;
      ctx->X[5] = 0;
      ctx->X[2] = 0;
      ctx->X[3] = 0;
      ctx->X[0] = 0;
      ctx->X[1] = 0;
      local_80 = hashBitLen;
      Skein1024_Process_Block(ctx,local_88,1,0x20);
      goto LAB_0010b11c;
    }
    puVar2 = SKEIN1024_IV_512;
  }
  puVar3 = ctx->X;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar3 = puVar3 + 1;
  }
LAB_0010b11c:
  (ctx->h).T[1] = 0x7000000000000000;
  (ctx->h).bCnt = 0;
  (ctx->h).T[0] = 0;
  return 0;
}

Assistant:

int Skein1024_Init(Skein1024_Ctxt_t *ctx, size_t hashBitLen)
{
    union
    {
        u08b_t  b[SKEIN1024_STATE_BYTES];
        u64b_t  w[SKEIN1024_STATE_WORDS];
    } cfg;                              /* config block */

    Skein_Assert(hashBitLen > 0,SKEIN_BAD_HASHLEN);
    ctx->h.hashBitLen = hashBitLen;         /* output hash bit count */

    switch (hashBitLen)
    {              /* use pre-computed values, where available */
    case  512:
        memcpy(ctx->X,SKEIN1024_IV_512 ,sizeof(ctx->X));
        break;
    case  384:
        memcpy(ctx->X,SKEIN1024_IV_384 ,sizeof(ctx->X));
        break;
    case 1024:
        memcpy(ctx->X,SKEIN1024_IV_1024,sizeof(ctx->X));
        break;
    default:
        /* here if there is no precomputed IV value available */
        /* build/process the config block, type == CONFIG (could be precomputed) */
        Skein_Start_New_Type(ctx,CFG_FINAL);        /* set tweaks: T0=0; T1=CFG | FINAL */

        cfg.w[0] = Skein_Swap64(SKEIN_SCHEMA_VER);  /* set the schema, version */
        cfg.w[1] = Skein_Swap64(hashBitLen);        /* hash result length in bits */
        cfg.w[2] = Skein_Swap64(SKEIN_CFG_TREE_INFO_SEQUENTIAL);
        memset(&cfg.w[3],0,sizeof(cfg) - 3*sizeof(cfg.w[0])); /* zero pad config block */

        /* compute the initial chaining values from config block */
        memset(ctx->X,0,sizeof(ctx->X));            /* zero the chaining variables */
        Skein1024_Process_Block(ctx,cfg.b,1,SKEIN_CFG_STR_LEN);
        break;
    }

    /* The chaining vars ctx->X are now initialized for the given hashBitLen. */
    /* Set up to process the data message portion of the hash (default) */
    Skein_Start_New_Type(ctx,MSG);              /* T0=0, T1= MSG type */

    return SKEIN_SUCCESS;
}